

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  initializer_list<google::protobuf::io::Printer::Sub> v_02;
  initializer_list<google::protobuf::io::Printer::Sub> v_03;
  undefined8 uVar1;
  bool bVar2;
  NewOpRequirements NVar3;
  FileDescriptor *file;
  size_type sVar4;
  AlphaNum *in_R8;
  Sub *local_1370;
  Sub *local_12a8;
  Sub *local_1220;
  Sub *local_11d0;
  char (*local_11b8) [9];
  Sub *local_1168;
  char (*local_1150) [9];
  basic_string_view<char,_std::char_traits<char>_> local_1118;
  undefined1 local_1102;
  allocator<char> local_1101;
  string local_1100;
  allocator<char> local_10d9;
  string local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  allocator<char> local_1089;
  string local_1088;
  string_view local_1068;
  unsigned_long local_1058;
  allocator<char> local_1049;
  string local_1048;
  Sub *local_1028;
  Sub local_1020;
  Sub local_f68;
  Sub local_eb0;
  Sub local_df8;
  Sub local_d40;
  iterator local_c88;
  size_type local_c80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c78;
  basic_string_view<char,_std::char_traits<char>_> local_c60;
  undefined1 local_c49;
  anon_class_16_2_fd512ddd_for_cb local_c48;
  allocator<char> local_c31;
  string local_c30;
  allocator<char> local_c09;
  string local_c08;
  allocator<char> local_be1;
  string local_be0;
  allocator<char> local_bb9;
  string local_bb8;
  allocator<char> local_b91;
  string local_b90;
  allocator<char> local_b69;
  string local_b68;
  Sub *local_b48;
  Sub local_b40;
  Sub local_a88;
  Sub local_9d0;
  Sub local_918;
  Sub local_860;
  Sub local_7a8;
  iterator local_6f0;
  size_type local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_6e0;
  undefined1 local_6d0 [8];
  anon_class_16_2_fd512ddd_for_cb pin_weak_descriptor;
  undefined1 auStack_6b8 [7];
  anon_class_1_0_00000001_for_cb emit_v2_data;
  anon_class_16_2_fd512ddd_for_cb custom_vtable_methods;
  anon_class_16_2_fd512ddd_for_cb is_initialized;
  anon_class_16_2_fd512ddd_for_cb on_demand_register_arena_dtor;
  AlphaNum local_680;
  string local_650;
  AlphaNum local_630;
  AlphaNum local_600;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  Sub *local_588;
  Sub local_580;
  iterator local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_4b8;
  undefined1 local_4a8 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  vars;
  basic_string_view<char,_std::char_traits<char>_> local_488;
  undefined1 local_471;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_470;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  Sub *local_410;
  Sub local_408;
  Sub local_350;
  iterator local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_288;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  undefined1 local_259;
  anon_class_16_2_fd512ddd_for_cb local_258;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_209;
  string local_208;
  Sub *local_1e8;
  Sub local_1e0;
  Sub local_128;
  iterator local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_60;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  ushort local_1b;
  byte local_19;
  undefined1 auStack_18 [5];
  NewOpRequirements new_op;
  Printer *p_local;
  MessageGenerator *this_local;
  
  _auStack_18 = p;
  NVar3 = GetNewOp(this,(Printer *)0x0);
  uVar1 = _auStack_18;
  local_1b = NVar3._0_2_;
  local_19 = NVar3.needs_to_run_constructor;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    inline void* $nonnull$ $classname$::PlacementNew_(\n        //~\n        const void* $nonnull$, void* $nonnull$ mem,\n        $pb$::Arena* $nullable$ arena) {\n      return ::new (mem) $classname$(arena);\n    }\n  "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit((Printer *)uVar1,local_30._M_len,local_30._M_str);
  uVar1 = _auStack_18;
  if ((local_19 & 1) == 0) {
    if ((local_1b & 0x100) == 0) {
      local_471 = 1;
      local_410 = &local_408;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"copy_type",&local_431);
      if ((local_1b & 1) == 0) {
        local_11b8 = (char (*) [9])0x1e35ec3;
      }
      else {
        local_11b8 = (char (*) [9])0x1f8c5d1;
      }
      protobuf::io::Printer::Sub::Sub<char_const(&)[9]>(&local_408,&local_430,local_11b8);
      local_410 = &local_350;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"arena_offsets",&local_459);
      local_470._8_8_ = auStack_18;
      local_470._M_allocated_capacity = (size_type)this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__1>
                (&local_350,&local_458,(anon_class_16_2_fd512ddd_for_cb *)&local_470);
      local_471 = 0;
      local_298 = &local_408;
      local_290 = 2;
      v_02._M_len = 2;
      v_02._M_array = local_298;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_288._M_local_buf,v_02);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_488,
                 "\n              constexpr auto $classname$::InternalNewImpl_() {\n                return $pbi$::MessageCreator::$copy_type$(sizeof($classname$),\n                                                          alignof($classname$));\n              }\n            "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                ((Printer *)uVar1,local_288._M_allocated_capacity,local_288._8_8_,local_488._M_len);
      local_11d0 = (Sub *)&local_298;
      in_R8 = (AlphaNum *)local_488._M_str;
      do {
        local_11d0 = local_11d0 + -1;
        protobuf::io::Printer::Sub::~Sub(local_11d0);
      } while (local_11d0 != &local_408);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator(&local_431);
    }
    else {
      local_259 = '\x01';
      local_1e8 = &local_1e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"copy_type",&local_209);
      if ((local_1b & 1) == 0) {
        local_1150 = (char (*) [9])0x1e35ec3;
      }
      else {
        local_1150 = (char (*) [9])0x1f8c5d1;
      }
      protobuf::io::Printer::Sub::Sub<char_const(&)[9]>(&local_1e0,&local_208,local_1150);
      local_1e8 = &local_128;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"arena_offsets",&local_241);
      local_258.p = (Printer **)auStack_18;
      local_258.this = this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__0>
                (&local_128,&local_240,&local_258);
      local_259 = '\0';
      local_70 = &local_1e0;
      local_68 = 2;
      v_03._M_len = 2;
      v_03._M_array = local_70;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_60._M_local_buf,v_03);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_270,
                 "\n              constexpr auto $classname$::InternalNewImpl_() {\n                constexpr auto arena_bits = $pbi$::EncodePlacementArenaOffsets({\n                    $arena_offsets$,\n                });\n                if (arena_bits.has_value()) {\n                  return $pbi$::MessageCreator::$copy_type$(\n                      sizeof($classname$), alignof($classname$), *arena_bits);\n                } else {\n                  return $pbi$::MessageCreator(&$classname$::PlacementNew_,\n                                               sizeof($classname$),\n                                               alignof($classname$));\n                }\n              }\n            "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                ((Printer *)uVar1,local_60._M_allocated_capacity,local_60._8_8_,local_270._M_len);
      local_1168 = (Sub *)&local_70;
      in_R8 = (AlphaNum *)local_270._M_str;
      do {
        local_1168 = local_1168 + -1;
        protobuf::io::Printer::Sub::~Sub(local_1168);
      } while (local_1168 != &local_1e0);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,
               "\n      constexpr auto $classname$::InternalNewImpl_() {\n        return $pbi$::MessageCreator(&$classname$::PlacementNew_,\n                                     sizeof($classname$), alignof($classname$));\n      }\n    "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit((Printer *)uVar1,local_48._M_len,local_48._M_str);
  }
  uVar1 = _auStack_18;
  local_588 = &local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"default_instance",&local_5a9);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_600,"&");
  DefaultInstanceName_abi_cxx11_
            (&local_650,(cpp *)this->descriptor_,(Descriptor *)&this->options_,(Options *)0x0,
             SUB81(in_R8,0));
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_630,&local_650);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_680,"._instance");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_5d0,(lts_20250127 *)&local_600,&local_630,&local_680,in_R8);
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_580,&local_5a8,&local_5d0);
  local_4c8 = &local_580;
  local_4c0 = 1;
  v_01._M_len = 1;
  v_01._M_array = local_4c8;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_4b8._M_local_buf,v_01);
  protobuf::io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_4a8,(Printer *)uVar1,(Span<const_google::protobuf::io::Printer::Sub>)local_4b8
            );
  local_1220 = (Sub *)&local_4c8;
  do {
    local_1220 = local_1220 + -1;
    protobuf::io::Printer::Sub::~Sub(local_1220);
  } while (local_1220 != &local_580);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  custom_vtable_methods.this = (MessageGenerator *)auStack_18;
  _auStack_6b8 = this;
  custom_vtable_methods.p = (Printer **)this;
  is_initialized.this = custom_vtable_methods.this;
  is_initialized.p = (Printer **)this;
  file = Descriptor::file(this->descriptor_);
  bVar2 = HasDescriptorMethods(file,&this->options_);
  uVar1 = _auStack_18;
  if (bVar2) {
    pin_weak_descriptor.this = (MessageGenerator *)auStack_18;
    local_c49 = '\x01';
    local_b48 = &local_b40;
    local_6d0 = (undefined1  [8])this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b68,"on_demand_register_arena_dtor",&local_b69);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__2_const&>
              (&local_b40,&local_b68,(anon_class_16_2_fd512ddd_for_cb *)&is_initialized.p);
    local_b48 = &local_a88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b90,"is_initialized",&local_b91);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__3_const&>
              (&local_a88,&local_b90,(anon_class_16_2_fd512ddd_for_cb *)&custom_vtable_methods.p);
    local_b48 = &local_9d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bb8,"pin_weak_descriptor",&local_bb9);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__4_const&>
              (&local_9d0,&local_bb8,(anon_class_16_2_fd512ddd_for_cb *)local_6d0);
    local_b48 = &local_918;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be0,"custom_vtable_methods",&local_be1);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__5_const&>
              (&local_918,&local_be0,(anon_class_16_2_fd512ddd_for_cb *)auStack_6b8);
    local_b48 = &local_860;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c08,"v2_data",&local_c09);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__6_const&>
              (&local_860,&local_c08,
               (anon_class_1_0_00000001_for_cb *)((long)&pin_weak_descriptor.p + 7));
    local_b48 = &local_7a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c30,"tracker_on_get_metadata",&local_c31);
    local_c48.p = (Printer **)auStack_18;
    local_c48.this = this;
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__7>
              (&local_7a8,&local_c30,&local_c48);
    local_c49 = '\0';
    local_6f0 = &local_b40;
    local_6e8 = 6;
    v_00._M_len = 6;
    v_00._M_array = local_6f0;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_6e0._M_local_buf,v_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_c60,
               "\n          constexpr auto $classname$::InternalGenerateClassData_() {\n            return $pbi$::ClassDataFull{\n                $pbi$::ClassData{\n                    $default_instance$,\n                    &_table_.header,\n                    $on_demand_register_arena_dtor$,\n                    $is_initialized$,\n                    &$classname$::MergeImpl,\n                    $superclass$::GetNewImpl<$classname$>(),\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                    &$classname$::SharedDtor,\n                    $custom_vtable_methods$,\n#endif  // PROTOBUF_CUSTOM_VTABLE\n                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),\n                    false,\n                    $v2_data$,\n                },\n                &$classname$::kDescriptorMethods,\n                &$desc_table$,\n                $tracker_on_get_metadata$,\n            };\n          }\n\n          PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1 const\n              $pbi$::ClassDataFull $classname$_class_data_ =\n                  $classname$::InternalGenerateClassData_();\n\n          //~ This function needs to be marked as weak to avoid significantly\n          //~ slowing down compilation times.  This breaks up LLVM\'s SCC\n          //~ in the .pb.cc translation units. Large translation units see a\n          //~ reduction of roughly 50% of walltime for optimized builds.\n          //~ Without the weak attribute all the messages in the file, including\n          //~ all the vtables and everything they use become part of the same\n          //~ SCC.\n          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$\n          $classname$::GetClassData() const {\n            $pin_weak_descriptor$;\n            $pbi$::PrefetchToLocalCache(&$classname$_class_data_);\n            $pbi$::PrefetchToLocalCache($classname$_class_data_.tc_table);\n            return $classname$_class_data_.base();\n          }\n        "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit
              ((Printer *)uVar1,local_6e0._M_allocated_capacity,local_6e0._8_8_,local_c60._M_len,
               local_c60._M_str);
    local_12a8 = (Sub *)&local_6f0;
    do {
      local_12a8 = local_12a8 + -1;
      protobuf::io::Printer::Sub::~Sub(local_12a8);
    } while (local_12a8 != &local_b40);
    std::__cxx11::string::~string((string *)&local_c30);
    std::allocator<char>::~allocator(&local_c31);
    std::__cxx11::string::~string((string *)&local_c08);
    std::allocator<char>::~allocator(&local_c09);
    std::__cxx11::string::~string((string *)&local_be0);
    std::allocator<char>::~allocator(&local_be1);
    std::__cxx11::string::~string((string *)&local_bb8);
    std::allocator<char>::~allocator(&local_bb9);
    std::__cxx11::string::~string((string *)&local_b90);
    std::allocator<char>::~allocator(&local_b91);
    std::__cxx11::string::~string((string *)&local_b68);
    std::allocator<char>::~allocator(&local_b69);
  }
  else {
    local_1102 = 1;
    local_1028 = &local_1020;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1048,"type_size",&local_1049);
    local_1068 = Descriptor::full_name(this->descriptor_);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_1068);
    local_1058 = sVar4 + 1;
    protobuf::io::Printer::Sub::Sub<unsigned_long>(&local_1020,&local_1048,&local_1058);
    local_1028 = &local_f68;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1088,"on_demand_register_arena_dtor",&local_1089);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__2_const&>
              (&local_f68,&local_1088,(anon_class_16_2_fd512ddd_for_cb *)&is_initialized.p);
    local_1028 = &local_eb0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10b0,"is_initialized",&local_10b1);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__3_const&>
              (&local_eb0,&local_10b0,(anon_class_16_2_fd512ddd_for_cb *)&custom_vtable_methods.p);
    local_1028 = &local_df8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_10d8,"custom_vtable_methods",&local_10d9);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__5_const&>
              (&local_df8,&local_10d8,(anon_class_16_2_fd512ddd_for_cb *)auStack_6b8);
    local_1028 = &local_d40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1100,"v2_data",&local_1101);
    protobuf::io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassData(google::protobuf::io::Printer*)::__6_const&>
              (&local_d40,&local_1100,
               (anon_class_1_0_00000001_for_cb *)((long)&pin_weak_descriptor.p + 7));
    local_1102 = 0;
    local_c88 = &local_1020;
    local_c80 = 5;
    v._M_len = 5;
    v._M_array = local_c88;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_c78._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1118,
               "\n          constexpr auto $classname$::InternalGenerateClassData_() {\n            return $pbi$::ClassDataLite<$type_size$>{\n                {\n                    $default_instance$,\n                    &_table_.header,\n                    $on_demand_register_arena_dtor$,\n                    $is_initialized$,\n                    &$classname$::MergeImpl,\n                    $superclass$::GetNewImpl<$classname$>(),\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n                    &$classname$::SharedDtor,\n                    $custom_vtable_methods$,\n#endif  // PROTOBUF_CUSTOM_VTABLE\n                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),\n                    true,\n                    $v2_data$,\n                },\n                \"$full_name$\",\n            };\n          }\n\n          PROTOBUF_CONSTINIT\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          const $pbi$::ClassDataLite<$type_size$> $classname$_class_data_ =\n              $classname$::InternalGenerateClassData_();\n\n          //~ This function needs to be marked as weak to avoid significantly\n          //~ slowing down compilation times.  This breaks up LLVM\'s SCC\n          //~ in the .pb.cc translation units. Large translation units see a\n          //~ reduction of roughly 50% of walltime for optimized builds.\n          //~ Without the weak attribute all the messages in the file, including\n          //~ all the vtables and everything they use become part of the same\n          //~ SCC.\n          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$\n          $classname$::GetClassData() const {\n            return $classname$_class_data_.base();\n          }\n        "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit
              ((Printer *)uVar1,local_c78._M_allocated_capacity,local_c78._8_8_,local_1118._M_len,
               local_1118._M_str);
    local_1370 = (Sub *)&local_c88;
    do {
      local_1370 = local_1370 + -1;
      protobuf::io::Printer::Sub::~Sub(local_1370);
    } while (local_1370 != &local_1020);
    std::__cxx11::string::~string((string *)&local_1100);
    std::allocator<char>::~allocator(&local_1101);
    std::__cxx11::string::~string((string *)&local_10d8);
    std::allocator<char>::~allocator(&local_10d9);
    std::__cxx11::string::~string((string *)&local_10b0);
    std::allocator<char>::~allocator(&local_10b1);
    std::__cxx11::string::~string((string *)&local_1088);
    std::allocator<char>::~allocator(&local_1089);
    std::__cxx11::string::~string((string *)&local_1048);
    std::allocator<char>::~allocator(&local_1049);
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_4a8);
  return;
}

Assistant:

void MessageGenerator::GenerateClassData(io::Printer* p) {
  const auto new_op = GetNewOp(nullptr);
  // Always generate PlacementNew_ because we might need it for different
  // reasons. EnableCustomNewFor<T> might be false in this compiler, or the
  // object might be too large for arena seeding.
  // We mark `inline` to avoid library bloat if the function is unused.
  p->Emit(R"cc(
    inline void* $nonnull$ $classname$::PlacementNew_(
        //~
        const void* $nonnull$, void* $nonnull$ mem,
        $pb$::Arena* $nullable$ arena) {
      return ::new (mem) $classname$(arena);
    }
  )cc");
  if (new_op.needs_to_run_constructor) {
    p->Emit(R"cc(
      constexpr auto $classname$::InternalNewImpl_() {
        return $pbi$::MessageCreator(&$classname$::PlacementNew_,
                                     sizeof($classname$), alignof($classname$));
      }
    )cc");
  } else if (new_op.needs_arena_seeding) {
    p->Emit({{"copy_type", new_op.needs_memcpy ? "CopyInit" : "ZeroInit"},
             {"arena_offsets", [&] { GetNewOp(p); }}},
            R"cc(
              constexpr auto $classname$::InternalNewImpl_() {
                constexpr auto arena_bits = $pbi$::EncodePlacementArenaOffsets({
                    $arena_offsets$,
                });
                if (arena_bits.has_value()) {
                  return $pbi$::MessageCreator::$copy_type$(
                      sizeof($classname$), alignof($classname$), *arena_bits);
                } else {
                  return $pbi$::MessageCreator(&$classname$::PlacementNew_,
                                               sizeof($classname$),
                                               alignof($classname$));
                }
              }
            )cc");
  } else {
    p->Emit({{"copy_type", new_op.needs_memcpy ? "CopyInit" : "ZeroInit"},
             {"arena_offsets", [&] { GetNewOp(p); }}},
            R"cc(
              constexpr auto $classname$::InternalNewImpl_() {
                return $pbi$::MessageCreator::$copy_type$(sizeof($classname$),
                                                          alignof($classname$));
              }
            )cc");
  }

  auto vars = p->WithVars(
      {{"default_instance",
        absl::StrCat("&", DefaultInstanceName(descriptor_, options_),
                     "._instance")}});
  const auto on_demand_register_arena_dtor = [&] {
    if (NeedsArenaDestructor() == ArenaDtorNeeds::kOnDemand) {
      p->Emit(R"cc(
        $classname$::OnDemandRegisterArenaDtor,
      )cc");
    } else {
      p->Emit(R"cc(
        nullptr,  // OnDemandRegisterArenaDtor
      )cc");
    }
  };
  const auto is_initialized = [&] {
    if (NeedsIsInitialized()) {
      p->Emit(R"cc(
        $classname$::IsInitializedImpl,
      )cc");
    } else {
      p->Emit(R"cc(
        nullptr,  // IsInitialized
      )cc");
    }
  };
  const auto custom_vtable_methods = [&] {
    if (HasGeneratedMethods(descriptor_->file(), options_) &&
        !IsMapEntryMessage(descriptor_)) {
      p->Emit(R"cc(
        $superclass$::GetClearImpl<$classname$>(), &$classname$::ByteSizeLong,
            &$classname$::_InternalSerialize,
      )cc");
    } else {
      p->Emit(R"cc(
        static_cast<void ($pb$::MessageLite::*)()>(&$classname$::ClearImpl),
            $superclass$::ByteSizeLongImpl, $superclass$::_InternalSerializeImpl
            ,
      )cc");
    }
  };

  const auto emit_v2_data = [&] {
  };

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    const auto pin_weak_descriptor = [&] {
      if (!UsingImplicitWeakDescriptor(descriptor_->file(), options_)) return;

      p->Emit({{"pin", StrongReferenceToType(descriptor_, options_)}},
              R"cc(
                $pin$;
              )cc");

      // For CODE_SIZE types, we need to pin the submessages too.
      // SPEED types will pin them via the TcParse table automatically.
      if (HasGeneratedMethods(descriptor_->file(), options_)) return;
      for (int i = 0; i < descriptor_->field_count(); ++i) {
        auto* field = descriptor_->field(i);
        if (field->type() != field->TYPE_MESSAGE) continue;
        p->Emit(
            {{"pin", StrongReferenceToType(field->message_type(), options_)}},
            R"cc(
              $pin$;
            )cc");
      }
    };
    p->Emit(
        {
            {"on_demand_register_arena_dtor", on_demand_register_arena_dtor},
            {"is_initialized", is_initialized},
            {"pin_weak_descriptor", pin_weak_descriptor},
            {"custom_vtable_methods", custom_vtable_methods},
            {"v2_data", emit_v2_data},
            {"tracker_on_get_metadata",
             [&] {
               if (HasTracker(descriptor_, options_)) {
                 p->Emit(R"cc(
                   &Impl_::TrackerOnGetMetadata,
                 )cc");
               } else {
                 p->Emit(R"cc(
                   nullptr,  // tracker
                 )cc");
               }
             }},
        },
        R"cc(
          constexpr auto $classname$::InternalGenerateClassData_() {
            return $pbi$::ClassDataFull{
                $pbi$::ClassData{
                    $default_instance$,
                    &_table_.header,
                    $on_demand_register_arena_dtor$,
                    $is_initialized$,
                    &$classname$::MergeImpl,
                    $superclass$::GetNewImpl<$classname$>(),
#if defined(PROTOBUF_CUSTOM_VTABLE)
                    &$classname$::SharedDtor,
                    $custom_vtable_methods$,
#endif  // PROTOBUF_CUSTOM_VTABLE
                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),
                    false,
                    $v2_data$,
                },
                &$classname$::kDescriptorMethods,
                &$desc_table$,
                $tracker_on_get_metadata$,
            };
          }

          PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1 const
              $pbi$::ClassDataFull $classname$_class_data_ =
                  $classname$::InternalGenerateClassData_();

          //~ This function needs to be marked as weak to avoid significantly
          //~ slowing down compilation times.  This breaks up LLVM's SCC
          //~ in the .pb.cc translation units. Large translation units see a
          //~ reduction of roughly 50% of walltime for optimized builds.
          //~ Without the weak attribute all the messages in the file, including
          //~ all the vtables and everything they use become part of the same
          //~ SCC.
          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$
          $classname$::GetClassData() const {
            $pin_weak_descriptor$;
            $pbi$::PrefetchToLocalCache(&$classname$_class_data_);
            $pbi$::PrefetchToLocalCache($classname$_class_data_.tc_table);
            return $classname$_class_data_.base();
          }
        )cc");
  } else {
    p->Emit(
        {
            {"type_size", descriptor_->full_name().size() + 1},
            {"on_demand_register_arena_dtor", on_demand_register_arena_dtor},
            {"is_initialized", is_initialized},
            {"custom_vtable_methods", custom_vtable_methods},
            {"v2_data", emit_v2_data},
        },
        R"cc(
          constexpr auto $classname$::InternalGenerateClassData_() {
            return $pbi$::ClassDataLite<$type_size$>{
                {
                    $default_instance$,
                    &_table_.header,
                    $on_demand_register_arena_dtor$,
                    $is_initialized$,
                    &$classname$::MergeImpl,
                    $superclass$::GetNewImpl<$classname$>(),
#if defined(PROTOBUF_CUSTOM_VTABLE)
                    &$classname$::SharedDtor,
                    $custom_vtable_methods$,
#endif  // PROTOBUF_CUSTOM_VTABLE
                    PROTOBUF_FIELD_OFFSET($classname$, $cached_size$),
                    true,
                    $v2_data$,
                },
                "$full_name$",
            };
          }

          PROTOBUF_CONSTINIT
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          const $pbi$::ClassDataLite<$type_size$> $classname$_class_data_ =
              $classname$::InternalGenerateClassData_();

          //~ This function needs to be marked as weak to avoid significantly
          //~ slowing down compilation times.  This breaks up LLVM's SCC
          //~ in the .pb.cc translation units. Large translation units see a
          //~ reduction of roughly 50% of walltime for optimized builds.
          //~ Without the weak attribute all the messages in the file, including
          //~ all the vtables and everything they use become part of the same
          //~ SCC.
          PROTOBUF_ATTRIBUTE_WEAK const $pbi$::ClassData* $nonnull$
          $classname$::GetClassData() const {
            return $classname$_class_data_.base();
          }
        )cc");
  }
}